

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test::TestBody
          (MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test *this)

{
  bool bVar1;
  FieldDescriptor *field;
  char *message;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string_view input_00;
  string local_3e0;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  local_390;
  allocator<char> local_381;
  string local_380;
  undefined1 local_360 [8];
  MessageDifferencer differ;
  size_t local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_1a0 [2];
  undefined1 local_180 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_1a0,"rm { a: 11\n b: 12 }");
  input._M_str = (char *)((long)&msg2.field_0 + 0xa0);
  input._M_len = (size_t)local_1a0[0]._M_str;
  TextFormat::MergeFromString((TextFormat *)local_1a0[0]._M_len,input,in_RCX);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&differ.unpack_any_field_,
             "rm { a: 11\n b: 13 }");
  input_00._M_str = local_180;
  input_00._M_len = local_1a8;
  TextFormat::MergeFromString
            ((TextFormat *)
             differ.unpack_any_field_.dynamic_message_factory_._M_t.
             super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl,
             input_00,in_RCX);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"rm",&local_381);
  field = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_380);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)local_360,field);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::make_unique<google::protobuf::(anonymous_namespace)::TestIgnorer>();
  std::
  unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>>
  ::
  unique_ptr<google::protobuf::(anonymous_namespace)::TestIgnorer,std::default_delete<google::protobuf::(anonymous_namespace)::TestIgnorer>,void>
            ((unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>>
              *)&local_390,
             (unique_ptr<google::protobuf::(anonymous_namespace)::TestIgnorer,_std::default_delete<google::protobuf::(anonymous_namespace)::TestIgnorer>_>
              *)&gtest_ar_.message_);
  util::MessageDifferencer::AddIgnoreCriteria((MessageDifferencer *)local_360,&local_390);
  std::
  unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  ::~unique_ptr(&local_390);
  std::
  unique_ptr<google::protobuf::(anonymous_namespace)::TestIgnorer,_std::default_delete<google::protobuf::(anonymous_namespace)::TestIgnorer>_>
  ::~unique_ptr((unique_ptr<google::protobuf::(anonymous_namespace)::TestIgnorer,_std::default_delete<google::protobuf::(anonymous_namespace)::TestIgnorer>_>
                 *)&gtest_ar_.message_);
  local_3a9 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_360,(Message *)((long)&msg2.field_0 + 0xa0),
                         (Message *)local_180);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e0,(internal *)local_3a8,(AssertionResult *)"differ.Compare(msg1, msg2)",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x960,message);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_360);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, TreatRepeatedFieldAsSetWithIgnoredFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  TextFormat::MergeFromString("rm { a: 11\n b: 12 }", &msg1);
  TextFormat::MergeFromString("rm { a: 11\n b: 13 }", &msg2);
  util::MessageDifferencer differ;
  differ.TreatAsSet(GetFieldDescriptor(msg1, "rm"));
  differ.AddIgnoreCriteria(std::make_unique<TestIgnorer>());
  EXPECT_TRUE(differ.Compare(msg1, msg2));
}